

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O3

void __thiscall Imf_3_4::TypedDeepImageChannel<float>::resize(TypedDeepImageChannel<float> *this)

{
  ulong uVar1;
  float **ppfVar2;
  
  ImageChannel::resize((ImageChannel *)this);
  if (this->_sampleListPointers != (float **)0x0) {
    operator_delete__(this->_sampleListPointers);
  }
  this->_sampleListPointers = (float **)0x0;
  uVar1 = (this->super_DeepImageChannel).super_ImageChannel._numPixels;
  ppfVar2 = (float **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 << 3);
  this->_sampleListPointers = ppfVar2;
  (*(this->super_DeepImageChannel).super_ImageChannel._vptr_ImageChannel[8])(this);
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::resize ()
{
    DeepImageChannel::resize ();

    delete[] _sampleListPointers;
    _sampleListPointers = 0;
    _sampleListPointers = new T*[numPixels ()];
    initializeSampleLists ();
}